

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_suite.cpp
# Opt level: O2

void __thiscall reader_url_suite::test_path_absolute_one::test_method(test_path_absolute_one *this)

{
  bool bVar1;
  uint local_270;
  value local_26c;
  view_type local_268;
  undefined8 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char input [13];
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  url reader;
  
  local_268.ptr_ = input;
  builtin_strncpy(input + 8,"path",5);
  builtin_strncpy(input,"scheme:/",8);
  local_268.len_ = strlen(local_268.ptr_);
  trial::url::reader::basic_url<char>::basic_url(&reader,&local_268);
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c8,0xa0);
  local_268.len_ = local_268.len_ & 0xffffffffffffff00;
  local_268.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_258 = &boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_e0 = "";
  local_26c = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_270 = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_268,&local_e8,0xa0,2,2,&local_26c,"reader.subcode()",&local_270,
             "url::token::subcode::scheme");
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0xa1);
  local_268.len_ = local_268.len_ & 0xffffffffffffff00;
  local_268.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_258 = &boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_110 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[7]>
            (&local_268,&local_118,0xa1,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"scheme","\"scheme\"");
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0xa2);
  local_268.len_ = local_268.len_ & 0xffffffffffffff00;
  local_268.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_258 = &boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_220 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_26c = CONCAT31(local_26c._1_3_,bVar1);
  local_270 = CONCAT31(local_270._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_268,&local_228,0xa2,2,2,&local_26c,"reader.next()",&local_270,"true");
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0xa3);
  local_268.len_ = local_268.len_ & 0xffffffffffffff00;
  local_268.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_258 = &boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_230 = "";
  local_26c = trial::url::token::category
                        (reader.super_base<char,_trial::url::reader::basic_url>.current_token);
  local_270 = 3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::category::value,trial::url::token::category::value>
            (&local_268,&local_238,0xa3,2,2,&local_26c,"reader.category()",&local_270,
             "url::token::category::path");
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0xa4);
  local_268.len_ = local_268.len_ & 0xffffffffffffff00;
  local_268.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_258 = &boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_180 = "";
  local_26c = trial::url::token::code
                        (reader.super_base<char,_trial::url::reader::basic_url>.current_token);
  local_270 = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
            (&local_268,&local_188,0xa4,2,2,&local_26c,"reader.code()",&local_270,
             "url::token::code::path_segment");
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0xa5);
  local_268.len_ = local_268.len_ & 0xffffffffffffff00;
  local_268.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_258 = &boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1b0 = "";
  local_26c = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_270 = 8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_268,&local_1b8,0xa5,2,2,&local_26c,"reader.subcode()",&local_270,
             "url::token::subcode::path_segment");
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0xa6);
  local_268.len_ = local_268.len_ & 0xffffffffffffff00;
  local_268.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_258 = &boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1e0 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[5]>
            (&local_268,&local_1e8,0xa6,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"path","\"path\"");
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1f0 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0xa7);
  local_268.len_ = local_268.len_ & 0xffffffffffffff00;
  local_268.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_258 = &boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_240 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_26c = CONCAT31(local_26c._1_3_,bVar1);
  local_270 = local_270 & 0xffffff00;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_268,&local_248,0xa7,2,2,&local_26c,"reader.next()",&local_270,"false");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_path_absolute_one)
{
    const char input[] = "scheme:/path";
    url::reader::url reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::scheme);
    BOOST_REQUIRE_EQUAL(reader.literal(), "scheme");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "path");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}